

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O0

void cbs_destroy(CBS_HANDLE cbs)

{
  LOGGER_LOG p_Var1;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *puVar2;
  CBS_OPERATION *pending_operation;
  LIST_ITEM_HANDLE first_pending_operation;
  LOGGER_LOG l;
  CBS_HANDLE cbs_local;
  
  if (cbs == (CBS_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_destroy",0x158,1,"NULL cbs handle");
    }
  }
  else {
    if (cbs->cbs_state != CBS_STATE_CLOSED) {
      amqp_management_close(cbs->amqp_management);
    }
    amqp_management_destroy(cbs->amqp_management);
    while (item_handle = singlylinkedlist_get_head_item(cbs->pending_operations),
          item_handle != (LIST_ITEM_HANDLE)0x0) {
      puVar2 = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
      if (puVar2 != (undefined8 *)0x0) {
        (*(code *)*puVar2)(puVar2[1],4,0,0);
        async_operation_destroy((ASYNC_OPERATION_HANDLE)puVar2[4]);
      }
      singlylinkedlist_remove(cbs->pending_operations,item_handle);
    }
    singlylinkedlist_destroy(cbs->pending_operations);
    free(cbs);
  }
  return;
}

Assistant:

void cbs_destroy(CBS_HANDLE cbs)
{
    if (cbs == NULL)
    {
        /* Codes_SRS_CBS_01_037: [ If `cbs` is NULL, `cbs_destroy` shall do nothing. ]*/
        LogError("NULL cbs handle");
    }
    else
    {
        LIST_ITEM_HANDLE first_pending_operation;

        /* Codes_SRS_CBS_01_100: [ If the CBS instance is not closed, all actions performed by `cbs_close` shall be performed. ]*/
        if (cbs->cbs_state != CBS_STATE_CLOSED)
        {
            (void)amqp_management_close(cbs->amqp_management);
        }

        /* Codes_SRS_CBS_01_036: [ `cbs_destroy` shall free all resources associated with the handle `cbs`. ]*/
        /* Codes_SRS_CBS_01_038: [ `cbs_destroy` shall free the AMQP management handle created in `cbs_create` by calling `amqp_management_destroy`. ]*/
        amqp_management_destroy(cbs->amqp_management);

        /* Codes_SRS_CBS_01_099: [ All pending operations shall be freed. ]*/
        while ((first_pending_operation = singlylinkedlist_get_head_item(cbs->pending_operations)) != NULL)
        {
            CBS_OPERATION* pending_operation = (CBS_OPERATION*)singlylinkedlist_item_get_value(first_pending_operation);
            if (pending_operation != NULL)
            {
                pending_operation->on_cbs_operation_complete(pending_operation->on_cbs_operation_complete_context, CBS_OPERATION_RESULT_INSTANCE_CLOSED, 0, NULL);
                async_operation_destroy(pending_operation->token_operation_async_context);
            }

            singlylinkedlist_remove(cbs->pending_operations, first_pending_operation);
        }

        /* Codes_SRS_CBS_01_098: [ `cbs_destroy` shall free the pending operations list by calling `singlylinkedlist_destroy`. ]*/
        singlylinkedlist_destroy(cbs->pending_operations);
        free(cbs);
    }
}